

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomization_functions.c
# Opt level: O3

int16_t WebRtcSpl_RandUArray(int16_t *vector,int16_t vector_length,uint32_t *seed)

{
  uint32_t uVar1;
  ulong uVar2;
  
  if (0 < vector_length) {
    uVar1 = *seed;
    uVar2 = 0;
    do {
      uVar1 = uVar1 * 0x10dcd + 1 & 0x7fffffff;
      vector[uVar2] = (int16_t)(uVar1 >> 0x10);
      uVar2 = uVar2 + 1;
    } while ((ushort)vector_length != uVar2);
    *seed = uVar1;
  }
  return vector_length;
}

Assistant:

int16_t WebRtcSpl_RandUArray(int16_t* vector,
                             int16_t vector_length,
                             uint32_t* seed) {
  int i;
  for (i = 0; i < vector_length; i++) {
    vector[i] = WebRtcSpl_RandU(seed);
  }
  return vector_length;
}